

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O1

int write_declare(char *format,...)

{
  char in_AL;
  uint uVar1;
  included *piVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  included **ppiVar4;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [8];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1024];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Da;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4e8 = 0x3000000008;
  local_4e0 = &args[0].overflow_arg_area;
  local_4c0 = in_RSI;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  vsnprintf(local_418,0x400,format,&local_4e8);
  ppiVar4 = &included_root;
  do {
    piVar2 = *ppiVar4;
    if (piVar2 == (included *)0x0) {
      fprintf((FILE *)header_file,"%s\n",local_418);
      piVar2 = (included *)operator_new(0x18);
      pcVar3 = strdup(local_418);
      piVar2->text = pcVar3;
      piVar2->left = (included *)0x0;
      piVar2->right = (included *)0x0;
      *ppiVar4 = piVar2;
      return 1;
    }
    uVar1 = strcmp(local_418,piVar2->text);
    ppiVar4 = &piVar2->left + (~uVar1 >> 0x1f);
  } while (uVar1 != 0);
  return 0;
}

Assistant:

int write_declare(const char *format, ...) {
  va_list args;
  char buf[1024];
  va_start(args, format);
  vsnprintf(buf, sizeof(buf), format, args);
  va_end(args);
  included **p = &included_root;
  while (*p) {
    int i = strcmp(buf,(*p)->text);
    if (!i) return 0;
    else if (i < 0) p = &((*p)->left);
    else p  = &((*p)->right);
  }
  fprintf(header_file,"%s\n",buf);
  *p = new included(buf);
  return 1;
}